

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Unique<vk::Handle<(vk::HandleType)12>_> obj3;
  Environment env;
  Unique<vk::Handle<(vk::HandleType)12>_> obj0;
  Move<vk::Handle<(vk::HandleType)12>_> local_188;
  Move<vk::Handle<(vk::HandleType)12>_> local_168;
  Move<vk::Handle<(vk::HandleType)12>_> local_148;
  VkBufferViewCreateInfo local_128;
  Environment local_f0;
  VkBufferView local_b8;
  Deleter<vk::Handle<(vk::HandleType)12>_> DStack_b0;
  Resources local_98;
  Move<vk::Handle<(vk::HandleType)12>_> local_48;
  
  local_f0.vkp = context->m_platformInterface;
  local_f0.vkd = Context::getDeviceInterface(context);
  local_f0.device = Context::getDevice(context);
  local_f0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_f0.programBinaries = context->m_progCollection;
  local_f0.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_f0.maxResourceConsumers = 4;
  BufferView::Resources::Resources(&local_98,&local_f0,(Parameters *)params.buffer.size);
  local_128.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.buffer.m_internal =
       local_98.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_128.format = params.format;
  local_128.offset = params.offset;
  local_128.range = params.range;
  ::vk::createBufferView
            (&local_168,local_f0.vkd,local_f0.device,&local_128,local_f0.allocationCallbacks);
  local_b8.m_internal =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  DStack_b0.m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  DStack_b0.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  DStack_b0.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_128.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.buffer.m_internal =
       local_98.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_128.format = params.format;
  local_128.offset = params.offset;
  local_128.range = params.range;
  ::vk::createBufferView
            (&local_188,local_f0.vkd,local_f0.device,&local_128,local_f0.allocationCallbacks);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_128.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.buffer.m_internal =
       local_98.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_128.format = params.format;
  local_128.offset = params.offset;
  local_128.range = params.range;
  ::vk::createBufferView
            (&local_148,local_f0.vkd,local_f0.device,&local_128,local_f0.allocationCallbacks);
  local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_128.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.buffer.m_internal =
       local_98.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_128.format = params.format;
  local_128.offset = params.offset;
  local_128.range = params.range;
  ::vk::createBufferView
            (&local_48,local_f0.vkd,local_f0.device,&local_128,local_f0.allocationCallbacks);
  local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  if (local_48.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&local_148.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               (VkBufferView)
               local_48.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
  }
  if (local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               (VkBufferView)
               local_188.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
  }
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
               (VkBufferView)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()(&DStack_b0,local_b8);
  }
  local_128._0_8_ = (void *)((long)&local_128 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_128._0_8_,
             (long)local_128.pNext + local_128._0_8_);
  if ((void *)local_128._0_8_ != (void *)((long)&local_128 + 0x10U)) {
    operator_delete((void *)local_128._0_8_,CONCAT44(local_128._20_4_,local_128.flags) + 1);
  }
  if (local_98.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_98.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_98.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
               m_internal);
  }
  local_98.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_98.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_98.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_98.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (local_98.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_98.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_98.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}